

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ComputeJ2(TPZDecomposed *this,TFad<6,_double> *J2)

{
  TFad<6,_double> *local_220;
  TFad<6,_double> *local_218;
  TFad<6,_double> *local_210;
  TFad<6,_double> **local_208;
  TFad<6,_double> *local_200;
  TFad<6,_double> ***local_1f8;
  TFad<6,_double> *local_1f0;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_1e8;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>
  local_1d8;
  TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_1c8;
  TFad<6,_double> **local_1b8;
  TFad<6,_double> *local_1b0;
  TFad<6,_double> ***local_1a8;
  TFad<6,_double> *local_1a0;
  TFad<6,_double> ****local_198;
  undefined8 local_190;
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_188;
  TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>
  local_178;
  TFad<6,_double> **local_168;
  TFad<6,_double> *local_160;
  TFad<6,_double> ***local_158;
  TFad<6,_double> *local_150;
  TFad<6,_double> ****local_148;
  undefined8 local_140;
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_138;
  TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>
  local_128;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>_>_>
  local_118;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_108;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>
  local_f8;
  TFad<6,_double> local_e8;
  TFad<6,_double> local_a8;
  TFad<6,_double> local_68;
  
  local_68.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_68.val_ = 0.0;
  local_68.dx_[0] = 0.0;
  local_68.dx_[1] = 0.0;
  local_68.dx_[2] = 0.0;
  local_68.dx_[3] = 0.0;
  local_68.dx_[4] = 0.0;
  local_68.dx_[5] = 0.0;
  local_a8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_a8.val_ = 0.0;
  local_a8.dx_[0] = 0.0;
  local_a8.dx_[1] = 0.0;
  local_a8.dx_[2] = 0.0;
  local_a8.dx_[3] = 0.0;
  local_a8.dx_[4] = 0.0;
  local_a8.dx_[5] = 0.0;
  local_e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_e8.val_ = 0.0;
  local_e8.dx_[0] = 0.0;
  local_e8.dx_[1] = 0.0;
  local_e8.dx_[2] = 0.0;
  local_e8.dx_[3] = 0.0;
  local_e8.dx_[4] = 0.0;
  local_e8.dx_[5] = 0.0;
  TFad<6,_double>::operator=(&local_68,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore);
  TFad<6,_double>::operator=
            (&local_a8,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + 1);
  TFad<6,_double>::operator=
            (&local_e8,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + 2);
  local_168 = &local_210;
  local_158 = &local_168;
  local_148 = &local_158;
  local_138.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_148;
  local_140 = 0x4008000000000000;
  local_128.fadexpr_.left_ = &local_138;
  local_118.fadexpr_.left_ = &local_128;
  local_128.fadexpr_.right_.constant_ = 2.0;
  local_1b8 = &local_218;
  local_1a8 = &local_1b8;
  local_198 = &local_1a8;
  local_188.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_198;
  local_190 = 0x4008000000000000;
  local_178.fadexpr_.left_ = &local_188;
  local_118.fadexpr_.right_ = &local_178;
  local_178.fadexpr_.right_.constant_ = 2.0;
  local_108.fadexpr_.left_ = &local_118;
  local_208 = &local_220;
  local_1f8 = &local_208;
  local_1e8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
        *)&local_1f8;
  local_1d8.fadexpr_.left_ = &local_1e8;
  local_1e8.fadexpr_.right_.constant_ = 3.0;
  local_1c8.fadexpr_.left_ = &local_1d8;
  local_108.fadexpr_.right_ = &local_1c8;
  local_1c8.fadexpr_.right_.constant_ = 2.0;
  local_f8.fadexpr_.left_ = &local_108;
  local_f8.fadexpr_.right_.constant_ = 2.0;
  local_220 = &local_68;
  local_218 = &local_68;
  local_210 = &local_68;
  local_200 = &local_a8;
  local_1f0 = &local_e8;
  local_1d8.fadexpr_.right_ = &local_e8;
  local_1b0 = &local_a8;
  local_1a0 = &local_e8;
  local_188.fadexpr_.left_ = &local_a8;
  local_160 = &local_a8;
  local_150 = &local_e8;
  local_138.fadexpr_.left_ = &local_68;
  TFad<6,double>::operator=((TFad<6,double> *)J2,&local_f8);
  return;
}

Assistant:

void ComputeJ2(T & J2) {
            T sig1, sig2, sig3;
            sig1 = this->fEigenvalues[0];
            sig2 = this->fEigenvalues[1];
            sig3 = this->fEigenvalues[2];
            J2 = (pow(sig1 + (-sig1 - sig2 - sig3) / 3., 2) + pow(sig2 + (-sig1 - sig2 - sig3) / 3., 2) + pow((-sig1 - sig2 - sig3) / 3. + sig3, 2)) / 2.;
        }